

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O1

pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
slang::ast::SemanticFacts::getDriveStrength(NetStrengthSyntax *syntax)

{
  TokenKind TVar1;
  SyntaxKind SVar2;
  bool bVar3;
  DriveStrength DVar4;
  DriveStrength DVar5;
  DriveStrength DVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_> pVar11;
  
  SVar2 = (syntax->super_SyntaxNode).kind;
  if (SVar2 == PullStrength) {
    TVar1 = *(TokenKind *)&syntax[1].super_SyntaxNode.previewNode;
    DVar6 = getDriveStrengthVal(TVar1);
    bVar3 = slang::syntax::SyntaxFacts::isStrength0(TVar1);
    uVar8 = 0;
    if (bVar3) {
      uVar8 = (ulong)DVar6;
    }
    uVar9 = (ulong)DVar6;
    if (bVar3) {
      uVar9 = 0;
    }
    uVar10 = (ulong)bVar3 << 0x20;
    uVar7 = (ulong)!bVar3 << 0x20;
  }
  else if (SVar2 == DriveStrength) {
    uVar10 = 0x100000000;
    DVar4 = getDriveStrengthVal(*(TokenKind *)&syntax[1].super_SyntaxNode.previewNode);
    TVar1 = (TokenKind)syntax[3].super_SyntaxNode.kind;
    DVar5 = getDriveStrengthVal(TVar1);
    bVar3 = slang::syntax::SyntaxFacts::isStrength0(TVar1);
    DVar6 = DVar5;
    if (bVar3) {
      DVar6 = DVar4;
    }
    uVar9 = (ulong)DVar6;
    if (bVar3) {
      DVar4 = DVar5;
    }
    uVar8 = (ulong)DVar4;
    uVar7 = 0x100000000;
  }
  else {
    uVar8 = 0;
    uVar10 = 0;
    uVar9 = 0;
    uVar7 = 0;
  }
  pVar11.first.super__Optional_base<slang::ast::DriveStrength,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::DriveStrength> =
       (_Optional_base<slang::ast::DriveStrength,_true,_true>)(uVar8 | uVar10);
  pVar11.second.super__Optional_base<slang::ast::DriveStrength,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::DriveStrength> =
       (_Optional_base<slang::ast::DriveStrength,_true,_true>)(uVar9 | uVar7);
  return pVar11;
}

Assistant:

std::pair<std::optional<DriveStrength>, std::optional<DriveStrength>> SemanticFacts::
    getDriveStrength(const syntax::NetStrengthSyntax& syntax) {

    if (syntax.kind == SyntaxKind::DriveStrength) {
        auto& ds = syntax.as<DriveStrengthSyntax>();
        auto val0 = getDriveStrengthVal(ds.strength0.kind);
        auto val1 = getDriveStrengthVal(ds.strength1.kind);
        if (SyntaxFacts::isStrength0(ds.strength1.kind))
            std::swap(val0, val1);

        return {val0, val1};
    }
    else if (syntax.kind == SyntaxKind::PullStrength) {
        auto kind = syntax.as<PullStrengthSyntax>().strength.kind;
        auto val = getDriveStrengthVal(kind);
        if (SyntaxFacts::isStrength0(kind))
            return {val, {}};
        else
            return {{}, val};
    }
    else {
        return {{}, {}};
    }
}